

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

ETraceStatus ProcessRailHit(FTraceResults *res,void *userdata)

{
  double dVar1;
  int iVar2;
  int local_7c;
  DVector2 ofs;
  SPortalHit local_68;
  
  if (res->HitType != TRACE_HitActor) {
    if (res->HitType == TRACE_CrossingPortal) {
      local_68.HitPos.Z = (res->HitPos).Z;
      local_68.HitPos.X = (res->HitPos).X;
      local_68.HitPos.Y = (res->HitPos).Y;
      local_68.ContPos.Z = (res->SrcFromTarget).Z;
      local_68.ContPos.X = (res->SrcFromTarget).X;
      local_68.ContPos.Y = (res->SrcFromTarget).Y;
      local_68.OutDir.Z = (res->HitVector).Z;
      local_68.OutDir.X = (res->HitVector).X;
      local_68.OutDir.Y = (res->HitVector).Y;
      TArray<SPortalHit,_SPortalHit>::Push
                ((TArray<SPortalHit,_SPortalHit> *)((long)userdata + 0x18),&local_68);
      return TRACE_Continue;
    }
    return TRACE_Stop;
  }
  if ((*(char *)((long)userdata + 0x2d) == '\x01') &&
     (((res->Actor->flags2).Value & 0x8000000) != 0)) {
    return TRACE_Stop;
  }
  if (*(char *)((long)userdata + 0x31) == '\0') {
    if (*(char *)((long)userdata + 0x30) == '\x01') {
      (*(res->Actor->super_DThinker).super_DObject._vptr_DObject[0x21])(&local_68);
      (**(code **)(**userdata + 0x108))(&ofs);
      if (local_68.HitPos.X._0_4_ == ofs.X._0_4_) {
        return TRACE_Skip;
      }
    }
    if ((*(char *)((long)userdata + 0x2f) != '\x01') ||
       ((*(res->Actor->super_DThinker).super_DObject._vptr_DObject[0x21])(&local_7c),
       local_7c != *(int *)((long)userdata + 0x28))) {
      if (*(char *)((long)userdata + 0x2e) == '\x01') {
        local_68.HitPos.X = (double)res->Actor;
        if (((((AActor *)local_68.HitPos.X)->flags3).Value & 8) != 0) {
          return TRACE_Skip;
        }
      }
      else {
        local_68.HitPos.X = (double)res->Actor;
      }
      dVar1 = (res->HitPos).Z;
      local_68.HitPos.Y = (res->HitPos).X;
      local_68.HitPos.Z = (res->HitPos).Y;
      local_68.ContPos.Y = (res->SrcAngleFromTarget).Degrees;
      local_68.ContPos.X = dVar1;
      if ((i_compatflags._3_1_ & 0x10) != 0) {
        P_GetOffsetPosition(local_68.HitPos.Y,local_68.HitPos.Z,(res->HitVector).X * -10.0,
                            (res->HitVector).Y * -10.0);
        local_68.HitPos.Y = (double)CONCAT44(ofs.X._4_4_,ofs.X._0_4_);
        local_68.HitPos.Z = ofs.Y;
        local_68.ContPos.X = dVar1 + (res->HitVector).Z * 10.0;
      }
      TArray<SRailHit,_SRailHit>::Push
                ((TArray<SRailHit,_SRailHit> *)((long)userdata + 8),(SRailHit *)&local_68);
      if (*(int *)((long)userdata + 0x34) == 0) {
        return *(byte *)((long)userdata + 0x2c) ^ TRACE_Continue;
      }
      iVar2 = *(int *)((long)userdata + 0x38) + 1;
      *(int *)((long)userdata + 0x38) = iVar2;
      if (*(char *)((long)userdata + 0x2c) == '\0') {
        return (uint)(iVar2 < *(int *)((long)userdata + 0x34));
      }
      return TRACE_Stop;
    }
  }
  return TRACE_Skip;
}

Assistant:

static ETraceStatus ProcessRailHit(FTraceResults &res, void *userdata)
{
	RailData *data = (RailData *)userdata;
	if (res.HitType == TRACE_CrossingPortal)
	{
		SPortalHit newhit;
		newhit.HitPos = res.HitPos;
		newhit.ContPos = res.SrcFromTarget;
		newhit.OutDir = res.HitVector;
		data->PortalHits.Push(newhit);
		return TRACE_Continue;
	}

	if (res.HitType != TRACE_HitActor)
	{
		return TRACE_Stop;
	}

	// Invulnerable things completely block the shot
	if (data->StopAtInvul && res.Actor->flags2 & MF2_INVULNERABLE)
	{
		return TRACE_Stop;
	}

	// Skip actors if the puff has:
	// 1. THRUACTORS (This one did NOT include a check for spectral)
	// 2. MTHRUSPECIES on puff and the shooter has same species as the hit actor
	// 3. THRUSPECIES on puff and the puff has same species as the hit actor
	// 4. THRUGHOST on puff and the GHOST flag on the hit actor

	if ((data->ThruActors) ||
		(data->MThruSpecies && res.Actor->GetSpecies() == data->Caller->GetSpecies()) ||
		(data->ThruSpecies && res.Actor->GetSpecies() == data->PuffSpecies) ||
		(data->ThruGhosts && res.Actor->flags3 & MF3_GHOST))
	{
		return TRACE_Skip;
	}

	// Save this thing for damaging later, and continue the trace
	SRailHit newhit;
	newhit.HitActor = res.Actor;
	newhit.HitPos = res.HitPos;
	newhit.HitAngle = res.SrcAngleFromTarget;
	if (i_compatflags & COMPATF_HITSCAN)
	{
		DVector2 ofs = P_GetOffsetPosition(newhit.HitPos.X, newhit.HitPos.Y, -10 * res.HitVector.X, -10 * res.HitVector.Y);
		newhit.HitPos.X = ofs.X;
		newhit.HitPos.Y = ofs.Y;
		newhit.HitPos.Z -= -10 * res.HitVector.Z;
	}
	data->RailHits.Push(newhit);

	if (data->limit)
	{
		data->count++;
	}
	return (data->StopAtOne || (data->limit && (data->count >= data->limit))) ? TRACE_Stop : TRACE_Continue;
}